

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytracer.cpp
# Opt level: O3

Color * __thiscall
RayTracer::m_calcLocalIllumination
          (Color *__return_storage_ptr__,RayTracer *this,Collision *coll,Material *material)

{
  Light *pLVar1;
  double dVar2;
  double dVar3;
  Scene *pSVar4;
  Vector3 *B;
  pointer ppLVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Vector3 l;
  Color color;
  Vector3 r;
  Color local_d8;
  Vector3 *local_b8;
  double local_b0;
  Color local_a8;
  Color local_90;
  Color local_78;
  Vector3 local_60;
  Color local_48;
  
  local_b8 = &coll->n;
  Vector3::reflect(&coll->ray_dir,local_b8);
  B = &coll->p;
  (*coll->object->_vptr_Object[3])(&local_a8,coll->object,B);
  operator*(&material->color,&local_a8);
  pSVar4 = this->m_scene;
  local_78.b = (pSVar4->m_ambient_color).b;
  local_78.r = (pSVar4->m_ambient_color).r;
  local_78.g = (pSVar4->m_ambient_color).g;
  operator*(&local_90,&local_78);
  Color::operator*(__return_storage_ptr__,&local_a8,material->diff);
  pSVar4 = this->m_scene;
  ppLVar5 = (pSVar4->m_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppLVar5 !=
      (pSVar4->m_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      (*(*ppLVar5)->_vptr_Light[4])(*ppLVar5,pSVar4,B);
      if (1e-06 <= (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da)) {
        (*(*ppLVar5)->_vptr_Light[2])(&local_48);
        operator-((Vector3 *)&local_48,B);
        Vector3::unitize((Vector3 *)&local_78);
        if (1e-06 < material->diff) {
          pLVar1 = *ppLVar5;
          local_d8.b = (pLVar1->m_color).b;
          local_d8.r = (pLVar1->m_color).r;
          local_d8.g = (pLVar1->m_color).g;
          operator*(&local_90,&local_d8);
          local_b0 = material->diff;
          dVar2 = Vector3::dot((Vector3 *)&local_a8,local_b8);
          Color::operator*(&local_78,&local_48,
                           dVar2 * local_b0 * (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
          Color::operator+=(__return_storage_ptr__,&local_78);
        }
        if (1e-06 < material->spec) {
          pLVar1 = *ppLVar5;
          local_d8.b = (pLVar1->m_color).b;
          local_d8.r = (pLVar1->m_color).r;
          local_d8.g = (pLVar1->m_color).g;
          operator*(&local_90,&local_d8);
          dVar2 = material->spec;
          dVar3 = Vector3::dot((Vector3 *)&local_a8,&local_60);
          dVar3 = pow(dVar3,50.0);
          Color::operator*(&local_78,&local_48,dVar3 * dVar2);
          Color::operator+=(__return_storage_ptr__,&local_78);
        }
      }
      ppLVar5 = ppLVar5 + 1;
      pSVar4 = this->m_scene;
    } while (ppLVar5 !=
             (pSVar4->m_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

Color RayTracer::m_calcLocalIllumination(const Collision& coll, const Material* material) const
{
    Vector3 r = coll.ray_dir.reflect(coll.n);
    Color color = material->color * coll.object->getTextureColor(coll.p);
    Color ret = color * m_scene->getAmbientLightColor() * material->diff; // 环境光
    for (auto light = m_scene->lightsBegin(); light != m_scene->lightsEnd(); light++)
    {
        double shade = (*light)->getShadowRatio(m_scene, coll.p);
        if (shade < Const::EPS) continue;

        Vector3 l = ((*light)->getSource() - coll.p).unitize();
        if (material->diff > Const::EPS) // 漫反射
            ret += color * (*light)->getColor() * (material->diff * l.dot(coll.n) * shade);
        if (material->spec > Const::EPS) // 镜面反射
            ret += color * (*light)->getColor() * (material->spec * pow(l.dot(r), SPEC_POWER));
    }
    return ret;
}